

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined4 uVar46;
  undefined1 (*pauVar47) [16];
  uint uVar48;
  ulong uVar49;
  undefined1 (*pauVar50) [16];
  long lVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  long lVar59;
  undefined1 (*pauVar60) [16];
  ulong uVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar71;
  undefined1 auVar67 [16];
  float fVar69;
  float fVar70;
  undefined1 auVar68 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  float fVar98;
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  uint uVar101;
  uint uVar102;
  uint uVar103;
  undefined1 auVar100 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined1 local_2690 [16];
  undefined1 local_2670 [16];
  Scene *local_2660;
  undefined8 uStack_2658;
  undefined1 local_2650 [16];
  long local_2638;
  long local_2630;
  long local_2628;
  undefined1 (*local_2620) [16];
  ulong local_2618;
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_2590 [16];
  float local_2580 [4];
  float local_2570 [4];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 local_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [16];
  RTCHitN local_2510 [16];
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar47 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar46;
  local_23c0._0_4_ = uVar46;
  local_23c0._8_4_ = uVar46;
  local_23c0._12_4_ = uVar46;
  local_23c0._16_4_ = uVar46;
  local_23c0._20_4_ = uVar46;
  local_23c0._24_4_ = uVar46;
  local_23c0._28_4_ = uVar46;
  auVar93 = ZEXT3264(local_23c0);
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar46;
  local_23e0._0_4_ = uVar46;
  local_23e0._8_4_ = uVar46;
  local_23e0._12_4_ = uVar46;
  local_23e0._16_4_ = uVar46;
  local_23e0._20_4_ = uVar46;
  local_23e0._24_4_ = uVar46;
  local_23e0._28_4_ = uVar46;
  auVar95 = ZEXT3264(local_23e0);
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar46;
  local_2400._0_4_ = uVar46;
  local_2400._8_4_ = uVar46;
  local_2400._12_4_ = uVar46;
  local_2400._16_4_ = uVar46;
  local_2400._20_4_ = uVar46;
  local_2400._24_4_ = uVar46;
  local_2400._28_4_ = uVar46;
  auVar97 = ZEXT3264(local_2400);
  uVar46 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4);
  local_2420._4_4_ = uVar46;
  local_2420._0_4_ = uVar46;
  local_2420._8_4_ = uVar46;
  local_2420._12_4_ = uVar46;
  local_2420._16_4_ = uVar46;
  local_2420._20_4_ = uVar46;
  local_2420._24_4_ = uVar46;
  local_2420._28_4_ = uVar46;
  auVar99 = ZEXT3264(local_2420);
  uVar46 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2440._4_4_ = uVar46;
  local_2440._0_4_ = uVar46;
  local_2440._8_4_ = uVar46;
  local_2440._12_4_ = uVar46;
  local_2440._16_4_ = uVar46;
  local_2440._20_4_ = uVar46;
  local_2440._24_4_ = uVar46;
  local_2440._28_4_ = uVar46;
  auVar100 = ZEXT3264(local_2440);
  uVar46 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2460._4_4_ = uVar46;
  local_2460._0_4_ = uVar46;
  local_2460._8_4_ = uVar46;
  local_2460._12_4_ = uVar46;
  local_2460._16_4_ = uVar46;
  local_2460._20_4_ = uVar46;
  local_2460._24_4_ = uVar46;
  local_2460._28_4_ = uVar46;
  auVar104 = ZEXT3264(local_2460);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2618 = uVar55 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_2480._4_4_ = iVar2;
  local_2480._0_4_ = iVar2;
  local_2480._8_4_ = iVar2;
  local_2480._12_4_ = iVar2;
  local_2480._16_4_ = iVar2;
  local_2480._20_4_ = iVar2;
  local_2480._24_4_ = iVar2;
  local_2480._28_4_ = iVar2;
  auVar109 = ZEXT3264(local_2480);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar68 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_2620 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_003e584c:
  do {
    pauVar60 = pauVar47 + -1;
    pauVar47 = pauVar47 + -1;
    if (*(float *)(*pauVar60 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar52 = *(ulong *)*pauVar47;
      while ((uVar52 & 8) == 0) {
        auVar92 = auVar93._0_32_;
        auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar55),auVar92);
        auVar17._4_4_ = auVar99._4_4_ * auVar16._4_4_;
        auVar17._0_4_ = auVar99._0_4_ * auVar16._0_4_;
        auVar17._8_4_ = auVar99._8_4_ * auVar16._8_4_;
        auVar17._12_4_ = auVar99._12_4_ * auVar16._12_4_;
        auVar17._16_4_ = auVar99._16_4_ * auVar16._16_4_;
        auVar17._20_4_ = auVar99._20_4_ * auVar16._20_4_;
        auVar17._24_4_ = auVar99._24_4_ * auVar16._24_4_;
        auVar17._28_4_ = auVar16._28_4_;
        auVar94 = auVar95._0_32_;
        auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar57),auVar94);
        auVar96._4_4_ = auVar100._4_4_ * auVar16._4_4_;
        auVar96._0_4_ = auVar100._0_4_ * auVar16._0_4_;
        auVar96._8_4_ = auVar100._8_4_ * auVar16._8_4_;
        auVar96._12_4_ = auVar100._12_4_ * auVar16._12_4_;
        auVar96._16_4_ = auVar100._16_4_ * auVar16._16_4_;
        auVar96._20_4_ = auVar100._20_4_ * auVar16._20_4_;
        auVar96._24_4_ = auVar100._24_4_ * auVar16._24_4_;
        auVar96._28_4_ = auVar16._28_4_;
        auVar16 = vmaxps_avx(auVar17,auVar96);
        auVar96 = auVar97._0_32_;
        auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + uVar61),auVar96);
        auVar18._4_4_ = auVar104._4_4_ * auVar17._4_4_;
        auVar18._0_4_ = auVar104._0_4_ * auVar17._0_4_;
        auVar18._8_4_ = auVar104._8_4_ * auVar17._8_4_;
        auVar18._12_4_ = auVar104._12_4_ * auVar17._12_4_;
        auVar18._16_4_ = auVar104._16_4_ * auVar17._16_4_;
        auVar18._20_4_ = auVar104._20_4_ * auVar17._20_4_;
        auVar18._24_4_ = auVar104._24_4_ * auVar17._24_4_;
        auVar18._28_4_ = auVar17._28_4_;
        auVar17 = vmaxps_avx(auVar18,auVar109._0_32_);
        local_25e0 = vmaxps_avx(auVar16,auVar17);
        auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + local_2618),auVar92);
        auVar19._4_4_ = auVar99._4_4_ * auVar16._4_4_;
        auVar19._0_4_ = auVar99._0_4_ * auVar16._0_4_;
        auVar19._8_4_ = auVar99._8_4_ * auVar16._8_4_;
        auVar19._12_4_ = auVar99._12_4_ * auVar16._12_4_;
        auVar19._16_4_ = auVar99._16_4_ * auVar16._16_4_;
        auVar19._20_4_ = auVar99._20_4_ * auVar16._20_4_;
        auVar19._24_4_ = auVar99._24_4_ * auVar16._24_4_;
        auVar19._28_4_ = auVar16._28_4_;
        auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + (uVar57 ^ 0x20)),auVar94);
        auVar20._4_4_ = auVar100._4_4_ * auVar16._4_4_;
        auVar20._0_4_ = auVar100._0_4_ * auVar16._0_4_;
        auVar20._8_4_ = auVar100._8_4_ * auVar16._8_4_;
        auVar20._12_4_ = auVar100._12_4_ * auVar16._12_4_;
        auVar20._16_4_ = auVar100._16_4_ * auVar16._16_4_;
        auVar20._20_4_ = auVar100._20_4_ * auVar16._20_4_;
        auVar20._24_4_ = auVar100._24_4_ * auVar16._24_4_;
        auVar20._28_4_ = auVar16._28_4_;
        auVar16 = vminps_avx(auVar19,auVar20);
        auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar52 + 0x40 + (uVar61 ^ 0x20)),auVar96);
        auVar21._4_4_ = auVar104._4_4_ * auVar17._4_4_;
        auVar21._0_4_ = auVar104._0_4_ * auVar17._0_4_;
        auVar21._8_4_ = auVar104._8_4_ * auVar17._8_4_;
        auVar21._12_4_ = auVar104._12_4_ * auVar17._12_4_;
        auVar21._16_4_ = auVar104._16_4_ * auVar17._16_4_;
        auVar21._20_4_ = auVar104._20_4_ * auVar17._20_4_;
        auVar21._24_4_ = auVar104._24_4_ * auVar17._24_4_;
        auVar21._28_4_ = auVar17._28_4_;
        auVar17 = vminps_avx(auVar21,auVar68._0_32_);
        auVar16 = vminps_avx(auVar16,auVar17);
        auVar16 = vcmpps_avx(local_25e0,auVar16,2);
        uVar48 = vmovmskps_avx(auVar16);
        if (uVar48 == 0) {
          if (pauVar47 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_003e584c;
        }
        uVar48 = uVar48 & 0xff;
        uVar58 = uVar52 & 0xfffffffffffffff0;
        lVar54 = 0;
        if (uVar48 != 0) {
          for (; (uVar48 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
          }
        }
        uVar52 = *(ulong *)(uVar58 + lVar54 * 8);
        uVar48 = uVar48 - 1 & uVar48;
        if (uVar48 != 0) {
          uVar101 = *(uint *)(local_25e0 + lVar54 * 4);
          lVar54 = 0;
          if (uVar48 != 0) {
            for (; (uVar48 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
            }
          }
          uVar49 = *(ulong *)(uVar58 + lVar54 * 8);
          uVar102 = *(uint *)(local_25e0 + lVar54 * 4);
          uVar48 = uVar48 - 1 & uVar48;
          if (uVar48 == 0) {
            if (uVar101 < uVar102) {
              *(ulong *)*pauVar47 = uVar49;
              *(uint *)(*pauVar47 + 8) = uVar102;
              pauVar47 = pauVar47 + 1;
            }
            else {
              *(ulong *)*pauVar47 = uVar52;
              *(uint *)(*pauVar47 + 8) = uVar101;
              pauVar47 = pauVar47 + 1;
              uVar52 = uVar49;
            }
          }
          else {
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar52;
            auVar72 = vpunpcklqdq_avx(auVar72,ZEXT416(uVar101));
            auVar84._8_8_ = 0;
            auVar84._0_8_ = uVar49;
            auVar84 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar102));
            lVar54 = 0;
            if (uVar48 != 0) {
              for (; (uVar48 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
              }
            }
            auVar90._8_8_ = 0;
            auVar90._0_8_ = *(ulong *)(uVar58 + lVar54 * 8);
            auVar73 = vpunpcklqdq_avx(auVar90,ZEXT416(*(uint *)(local_25e0 + lVar54 * 4)));
            auVar90 = vpcmpgtd_avx(auVar84,auVar72);
            uVar48 = uVar48 - 1 & uVar48;
            if (uVar48 == 0) {
              auVar91 = vpshufd_avx(auVar90,0xaa);
              auVar90 = vblendvps_avx(auVar84,auVar72,auVar91);
              auVar72 = vblendvps_avx(auVar72,auVar84,auVar91);
              auVar84 = vpcmpgtd_avx(auVar73,auVar90);
              auVar91 = vpshufd_avx(auVar84,0xaa);
              auVar84 = vblendvps_avx(auVar73,auVar90,auVar91);
              auVar90 = vblendvps_avx(auVar90,auVar73,auVar91);
              auVar73 = vpcmpgtd_avx(auVar90,auVar72);
              auVar91 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar90,auVar72,auVar91);
              auVar72 = vblendvps_avx(auVar72,auVar90,auVar91);
              *pauVar47 = auVar72;
              pauVar47[1] = auVar73;
              uVar52 = auVar84._0_8_;
              pauVar47 = pauVar47 + 2;
            }
            else {
              lVar54 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                }
              }
              auVar91._8_8_ = 0;
              auVar91._0_8_ = *(ulong *)(uVar58 + lVar54 * 8);
              auVar91 = vpunpcklqdq_avx(auVar91,ZEXT416(*(uint *)(local_25e0 + lVar54 * 4)));
              uVar48 = uVar48 - 1 & uVar48;
              uVar49 = (ulong)uVar48;
              if (uVar48 == 0) {
                auVar63 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar84,auVar72,auVar63);
                auVar72 = vblendvps_avx(auVar72,auVar84,auVar63);
                auVar84 = vpcmpgtd_avx(auVar91,auVar73);
                auVar63 = vpshufd_avx(auVar84,0xaa);
                auVar84 = vblendvps_avx(auVar91,auVar73,auVar63);
                auVar73 = vblendvps_avx(auVar73,auVar91,auVar63);
                auVar91 = vpcmpgtd_avx(auVar73,auVar72);
                auVar63 = vpshufd_avx(auVar91,0xaa);
                auVar91 = vblendvps_avx(auVar73,auVar72,auVar63);
                auVar72 = vblendvps_avx(auVar72,auVar73,auVar63);
                auVar73 = vpcmpgtd_avx(auVar84,auVar90);
                auVar63 = vpshufd_avx(auVar73,0xaa);
                auVar73 = vblendvps_avx(auVar84,auVar90,auVar63);
                auVar84 = vblendvps_avx(auVar90,auVar84,auVar63);
                auVar90 = vpcmpgtd_avx(auVar91,auVar84);
                auVar63 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar91,auVar84,auVar63);
                auVar84 = vblendvps_avx(auVar84,auVar91,auVar63);
                *pauVar47 = auVar72;
                pauVar47[1] = auVar84;
                pauVar47[2] = auVar90;
                uVar52 = auVar73._0_8_;
                pauVar60 = pauVar47 + 3;
              }
              else {
                *pauVar47 = auVar72;
                pauVar47[1] = auVar84;
                pauVar47[2] = auVar73;
                pauVar47[3] = auVar91;
                lVar54 = 0x30;
                do {
                  lVar56 = lVar54;
                  lVar54 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                    }
                  }
                  uVar52 = *(ulong *)(uVar58 + lVar54 * 8);
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar52;
                  auVar72 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_25e0 + lVar54 * 4)));
                  *(undefined1 (*) [16])(pauVar47[1] + lVar56) = auVar72;
                  uVar49 = uVar49 & uVar49 - 1;
                  lVar54 = lVar56 + 0x10;
                } while (uVar49 != 0);
                pauVar60 = (undefined1 (*) [16])(pauVar47[1] + lVar56);
                if (lVar56 + 0x10 != 0) {
                  lVar54 = 0x10;
                  pauVar50 = pauVar47;
                  do {
                    auVar72 = pauVar50[1];
                    pauVar50 = pauVar50 + 1;
                    uVar48 = vextractps_avx(auVar72,2);
                    lVar56 = lVar54;
                    do {
                      if (uVar48 <= *(uint *)(pauVar47[-1] + lVar56 + 8)) {
                        pauVar53 = (undefined1 (*) [16])(*pauVar47 + lVar56);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar47 + lVar56) =
                           *(undefined1 (*) [16])(pauVar47[-1] + lVar56);
                      lVar56 = lVar56 + -0x10;
                      pauVar53 = pauVar47;
                    } while (lVar56 != 0);
                    *pauVar53 = auVar72;
                    lVar54 = lVar54 + 0x10;
                  } while (pauVar60 != pauVar50);
                  uVar52 = *(ulong *)*pauVar60;
                }
              }
              auVar93 = ZEXT3264(auVar92);
              auVar95 = ZEXT3264(auVar94);
              auVar97 = ZEXT3264(auVar96);
              auVar99 = ZEXT3264(auVar99._0_32_);
              auVar100 = ZEXT3264(auVar100._0_32_);
              auVar104 = ZEXT3264(auVar104._0_32_);
              auVar109 = ZEXT3264(auVar109._0_32_);
              pauVar47 = pauVar60;
            }
          }
        }
      }
      lVar54 = (ulong)((uint)uVar52 & 0xf) - 8;
      if (lVar54 != 0) {
        uVar52 = uVar52 & 0xfffffffffffffff0;
        lVar56 = 0;
        do {
          lVar59 = lVar56 * 0xb0;
          pfVar1 = (float *)(uVar52 + 0x80 + lVar59);
          fVar22 = *pfVar1;
          fVar23 = pfVar1[1];
          fVar24 = pfVar1[2];
          fVar25 = pfVar1[3];
          pfVar1 = (float *)(uVar52 + 0x40 + lVar59);
          fVar26 = *pfVar1;
          fVar27 = pfVar1[1];
          fVar28 = pfVar1[2];
          fVar29 = pfVar1[3];
          auVar63._0_4_ = fVar22 * fVar26;
          auVar63._4_4_ = fVar23 * fVar27;
          auVar63._8_4_ = fVar24 * fVar28;
          auVar63._12_4_ = fVar25 * fVar29;
          pfVar1 = (float *)(uVar52 + 0x70 + lVar59);
          fVar30 = *pfVar1;
          fVar31 = pfVar1[1];
          fVar32 = pfVar1[2];
          fVar33 = pfVar1[3];
          pfVar1 = (float *)(uVar52 + 0x50 + lVar59);
          fVar34 = *pfVar1;
          fVar35 = pfVar1[1];
          fVar36 = pfVar1[2];
          fVar37 = pfVar1[3];
          auVar74._0_4_ = fVar30 * fVar34;
          auVar74._4_4_ = fVar31 * fVar35;
          auVar74._8_4_ = fVar32 * fVar36;
          auVar74._12_4_ = fVar33 * fVar37;
          local_2550 = vsubps_avx(auVar74,auVar63);
          pfVar1 = (float *)(uVar52 + 0x60 + lVar59);
          fVar38 = *pfVar1;
          fVar39 = pfVar1[1];
          fVar40 = pfVar1[2];
          fVar41 = pfVar1[3];
          auVar75._0_4_ = fVar38 * fVar34;
          auVar75._4_4_ = fVar39 * fVar35;
          auVar75._8_4_ = fVar40 * fVar36;
          auVar75._12_4_ = fVar41 * fVar37;
          pfVar1 = (float *)(uVar52 + 0x30 + lVar59);
          fVar42 = *pfVar1;
          fVar43 = pfVar1[1];
          fVar44 = pfVar1[2];
          fVar45 = pfVar1[3];
          auVar85._0_4_ = fVar22 * fVar42;
          auVar85._4_4_ = fVar23 * fVar43;
          auVar85._8_4_ = fVar24 * fVar44;
          auVar85._12_4_ = fVar25 * fVar45;
          auVar90 = vsubps_avx(auVar85,auVar75);
          auVar86._0_4_ = fVar30 * fVar42;
          auVar86._4_4_ = fVar31 * fVar43;
          auVar86._8_4_ = fVar32 * fVar44;
          auVar86._12_4_ = fVar33 * fVar45;
          auVar105._0_4_ = fVar38 * fVar26;
          auVar105._4_4_ = fVar39 * fVar27;
          auVar105._8_4_ = fVar40 * fVar28;
          auVar105._12_4_ = fVar41 * fVar29;
          auVar73 = vsubps_avx(auVar105,auVar86);
          uVar46 = *(undefined4 *)(ray + k * 4);
          auVar106._4_4_ = uVar46;
          auVar106._0_4_ = uVar46;
          auVar106._8_4_ = uVar46;
          auVar106._12_4_ = uVar46;
          auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + lVar59),auVar106);
          uVar46 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar107._4_4_ = uVar46;
          auVar107._0_4_ = uVar46;
          auVar107._8_4_ = uVar46;
          auVar107._12_4_ = uVar46;
          auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x10 + lVar59),auVar107);
          uVar46 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar108._4_4_ = uVar46;
          auVar108._0_4_ = uVar46;
          auVar108._8_4_ = uVar46;
          auVar108._12_4_ = uVar46;
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + lVar59),auVar108);
          fVar62 = *(float *)(ray + k * 4 + 0x50);
          fVar69 = *(float *)(ray + k * 4 + 0x60);
          fVar71 = auVar84._0_4_;
          auVar110._0_4_ = fVar62 * fVar71;
          fVar7 = auVar84._4_4_;
          auVar110._4_4_ = fVar62 * fVar7;
          fVar10 = auVar84._8_4_;
          auVar110._8_4_ = fVar62 * fVar10;
          fVar13 = auVar84._12_4_;
          auVar110._12_4_ = fVar62 * fVar13;
          fVar98 = auVar72._0_4_;
          auVar111._0_4_ = fVar69 * fVar98;
          fVar8 = auVar72._4_4_;
          auVar111._4_4_ = fVar69 * fVar8;
          fVar11 = auVar72._8_4_;
          auVar111._8_4_ = fVar69 * fVar11;
          fVar14 = auVar72._12_4_;
          auVar111._12_4_ = fVar69 * fVar14;
          auVar84 = vsubps_avx(auVar111,auVar110);
          fVar70 = *(float *)(ray + k * 4 + 0x40);
          fVar6 = auVar91._0_4_;
          auVar64._0_4_ = fVar69 * fVar6;
          fVar9 = auVar91._4_4_;
          auVar64._4_4_ = fVar69 * fVar9;
          fVar12 = auVar91._8_4_;
          auVar64._8_4_ = fVar69 * fVar12;
          fVar15 = auVar91._12_4_;
          auVar64._12_4_ = fVar69 * fVar15;
          auVar76._0_4_ = fVar70 * fVar71;
          auVar76._4_4_ = fVar70 * fVar7;
          auVar76._8_4_ = fVar70 * fVar10;
          auVar76._12_4_ = fVar70 * fVar13;
          auVar63 = vsubps_avx(auVar76,auVar64);
          auVar77._0_4_ = fVar70 * fVar98;
          auVar77._4_4_ = fVar70 * fVar8;
          auVar77._8_4_ = fVar70 * fVar11;
          auVar77._12_4_ = fVar70 * fVar14;
          auVar87._0_4_ = fVar62 * fVar6;
          auVar87._4_4_ = fVar62 * fVar9;
          auVar87._8_4_ = fVar62 * fVar12;
          auVar87._12_4_ = fVar62 * fVar15;
          auVar64 = vsubps_avx(auVar87,auVar77);
          auVar88._0_4_ =
               local_2550._0_4_ * fVar70 + fVar62 * auVar90._0_4_ + fVar69 * auVar73._0_4_;
          auVar88._4_4_ =
               local_2550._4_4_ * fVar70 + fVar62 * auVar90._4_4_ + fVar69 * auVar73._4_4_;
          auVar88._8_4_ =
               local_2550._8_4_ * fVar70 + fVar62 * auVar90._8_4_ + fVar69 * auVar73._8_4_;
          auVar88._12_4_ =
               local_2550._12_4_ * fVar70 + fVar62 * auVar90._12_4_ + fVar69 * auVar73._12_4_;
          auVar78._8_4_ = 0x80000000;
          auVar78._0_8_ = 0x8000000080000000;
          auVar78._12_4_ = 0x80000000;
          auVar72 = vandps_avx(auVar88,auVar78);
          uVar48 = auVar72._0_4_;
          local_25e0._0_4_ =
               (float)(uVar48 ^ (uint)(fVar38 * auVar84._0_4_ +
                                      fVar22 * auVar64._0_4_ + fVar30 * auVar63._0_4_));
          uVar101 = auVar72._4_4_;
          local_25e0._4_4_ =
               (float)(uVar101 ^
                      (uint)(fVar39 * auVar84._4_4_ +
                            fVar23 * auVar64._4_4_ + fVar31 * auVar63._4_4_));
          uVar102 = auVar72._8_4_;
          local_25e0._8_4_ =
               (float)(uVar102 ^
                      (uint)(fVar40 * auVar84._8_4_ +
                            fVar24 * auVar64._8_4_ + fVar32 * auVar63._8_4_));
          uVar103 = auVar72._12_4_;
          local_25e0._12_4_ =
               (float)(uVar103 ^
                      (uint)(fVar41 * auVar84._12_4_ +
                            fVar25 * auVar64._12_4_ + fVar33 * auVar63._12_4_));
          local_25e0._16_4_ =
               (float)(uVar48 ^ (uint)(fVar42 * auVar84._0_4_ +
                                      fVar34 * auVar64._0_4_ + fVar26 * auVar63._0_4_));
          local_25e0._20_4_ =
               (float)(uVar101 ^
                      (uint)(fVar43 * auVar84._4_4_ +
                            fVar35 * auVar64._4_4_ + fVar27 * auVar63._4_4_));
          local_25e0._24_4_ =
               (float)(uVar102 ^
                      (uint)(fVar44 * auVar84._8_4_ +
                            fVar36 * auVar64._8_4_ + fVar28 * auVar63._8_4_));
          local_25e0._28_4_ =
               (float)(uVar103 ^
                      (uint)(fVar45 * auVar84._12_4_ +
                            fVar37 * auVar64._12_4_ + fVar29 * auVar63._12_4_));
          auVar63 = ZEXT816(0) << 0x20;
          auVar72 = vcmpps_avx(local_25e0._0_16_,auVar63,5);
          auVar84 = vcmpps_avx(local_25e0._16_16_,auVar63,5);
          auVar72 = vandps_avx(auVar72,auVar84);
          auVar79._8_4_ = 0x7fffffff;
          auVar79._0_8_ = 0x7fffffff7fffffff;
          auVar79._12_4_ = 0x7fffffff;
          local_25b0 = vandps_avx(auVar88,auVar79);
          auVar84 = vcmpps_avx(auVar63,auVar88,4);
          auVar72 = vandps_avx(auVar72,auVar84);
          auVar65._0_4_ = local_25e0._0_4_ + local_25e0._16_4_;
          auVar65._4_4_ = local_25e0._4_4_ + local_25e0._20_4_;
          auVar65._8_4_ = local_25e0._8_4_ + local_25e0._24_4_;
          auVar65._12_4_ = local_25e0._12_4_ + local_25e0._28_4_;
          auVar84 = vcmpps_avx(auVar65,local_25b0,2);
          auVar63 = auVar84 & auVar72;
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') {
            auVar72 = vandps_avx(auVar72,auVar84);
            local_25c0._0_4_ =
                 (float)(uVar48 ^ (uint)(local_2550._0_4_ * fVar6 +
                                        fVar98 * auVar90._0_4_ + fVar71 * auVar73._0_4_));
            local_25c0._4_4_ =
                 (float)(uVar101 ^
                        (uint)(local_2550._4_4_ * fVar9 +
                              fVar8 * auVar90._4_4_ + fVar7 * auVar73._4_4_));
            local_25c0._8_4_ =
                 (float)(uVar102 ^
                        (uint)(local_2550._8_4_ * fVar12 +
                              fVar11 * auVar90._8_4_ + fVar10 * auVar73._8_4_));
            local_25c0._12_4_ =
                 (float)(uVar103 ^
                        (uint)(local_2550._12_4_ * fVar15 +
                              fVar14 * auVar90._12_4_ + fVar13 * auVar73._12_4_));
            fVar62 = *(float *)(ray + k * 4 + 0x30);
            fVar69 = local_25b0._0_4_;
            auVar66._0_4_ = fVar69 * fVar62;
            fVar70 = local_25b0._4_4_;
            auVar66._4_4_ = fVar70 * fVar62;
            fVar71 = local_25b0._8_4_;
            auVar66._8_4_ = fVar71 * fVar62;
            fVar98 = local_25b0._12_4_;
            auVar66._12_4_ = fVar98 * fVar62;
            auVar84 = vcmpps_avx(auVar66,local_25c0,1);
            fVar62 = *(float *)(ray + k * 4 + 0x80);
            auVar93 = ZEXT1664(CONCAT412(fVar62,CONCAT48(fVar62,CONCAT44(fVar62,fVar62))));
            auVar80._0_4_ = fVar69 * fVar62;
            auVar80._4_4_ = fVar70 * fVar62;
            auVar80._8_4_ = fVar71 * fVar62;
            auVar80._12_4_ = fVar98 * fVar62;
            auVar63 = vcmpps_avx(local_25c0,auVar80,2);
            auVar84 = vandps_avx(auVar84,auVar63);
            auVar63 = auVar72 & auVar84;
            if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              local_2670 = vandps_avx(auVar72,auVar84);
              local_2590 = local_2670;
              local_26b0 = auVar90._0_8_;
              uStack_26a8 = auVar90._8_8_;
              local_2540 = local_26b0;
              uStack_2538 = uStack_26a8;
              local_26c0 = auVar73._0_8_;
              uStack_26b8 = auVar73._8_8_;
              local_2530 = local_26c0;
              uStack_2528 = uStack_26b8;
              uStack_2658 = auVar91._8_8_;
              local_2660 = context->scene;
              auVar72 = vrcpps_avx(local_25b0);
              fVar62 = auVar72._0_4_;
              auVar81._0_4_ = fVar69 * fVar62;
              fVar69 = auVar72._4_4_;
              auVar81._4_4_ = fVar70 * fVar69;
              fVar70 = auVar72._8_4_;
              auVar81._8_4_ = fVar71 * fVar70;
              fVar71 = auVar72._12_4_;
              auVar81._12_4_ = fVar98 * fVar71;
              auVar89._8_4_ = 0x3f800000;
              auVar89._0_8_ = 0x3f8000003f800000;
              auVar89._12_4_ = 0x3f800000;
              auVar72 = vsubps_avx(auVar89,auVar81);
              fVar62 = fVar62 + fVar62 * auVar72._0_4_;
              fVar69 = fVar69 + fVar69 * auVar72._4_4_;
              fVar70 = fVar70 + fVar70 * auVar72._8_4_;
              fVar71 = fVar71 + fVar71 * auVar72._12_4_;
              local_2560._0_4_ = fVar62 * local_25c0._0_4_;
              local_2560._4_4_ = fVar69 * local_25c0._4_4_;
              local_2560._8_4_ = fVar70 * local_25c0._8_4_;
              local_2560._12_4_ = fVar71 * local_25c0._12_4_;
              auVar95 = ZEXT1664(local_2560);
              local_2580[0] = fVar62 * local_25e0._0_4_;
              local_2580[1] = fVar69 * local_25e0._4_4_;
              local_2580[2] = fVar70 * local_25e0._8_4_;
              local_2580[3] = fVar71 * local_25e0._12_4_;
              auVar82._8_4_ = 0x7f800000;
              auVar82._0_8_ = 0x7f8000007f800000;
              auVar82._12_4_ = 0x7f800000;
              auVar72 = vblendvps_avx(auVar82,local_2560,local_2670);
              local_2570[0] = fVar62 * local_25e0._16_4_;
              local_2570[1] = fVar69 * local_25e0._20_4_;
              local_2570[2] = fVar70 * local_25e0._24_4_;
              local_2570[3] = fVar71 * local_25e0._28_4_;
              auVar84 = vshufps_avx(auVar72,auVar72,0xb1);
              auVar84 = vminps_avx(auVar84,auVar72);
              auVar90 = vshufpd_avx(auVar84,auVar84,1);
              auVar84 = vminps_avx(auVar90,auVar84);
              auVar72 = vcmpps_avx(auVar72,auVar84,0);
              auVar90 = local_2670 & auVar72;
              auVar84 = vpcmpeqd_avx(auVar84,auVar84);
              if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar90[0xf] < '\0') {
                auVar84 = auVar72;
              }
              lVar59 = lVar59 + uVar52;
              auVar72 = vandps_avx(local_2670,auVar84);
              uVar46 = vmovmskps_avx(auVar72);
              uVar58 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar46);
              lVar51 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                }
              }
LAB_003e5f3c:
              uVar48 = *(uint *)(lVar59 + 0x90 + lVar51 * 4);
              lVar4 = *(long *)(*(long *)((long)local_2660 + 0x1e8) + (ulong)uVar48 * 8);
              if ((*(uint *)(lVar4 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2670 + lVar51 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (*(long *)(lVar4 + 0x40) == 0)) {
                  fVar62 = local_2580[lVar51];
                  fVar69 = local_2570[lVar51];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + lVar51 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2550 + lVar51 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) =
                       *(undefined4 *)((long)&local_2540 + lVar51 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)((long)&local_2530 + lVar51 * 4);
                  *(float *)(ray + k * 4 + 0xf0) = fVar62;
                  *(float *)(ray + k * 4 + 0x100) = fVar69;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar59 + 0xa0 + lVar51 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar48;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_003e5dd5;
                }
                local_2520 = auVar95._0_16_;
                fVar62 = local_2580[lVar51];
                local_24e0._4_4_ = fVar62;
                local_24e0._0_4_ = fVar62;
                local_24e0._8_4_ = fVar62;
                local_24e0._12_4_ = fVar62;
                local_24d0 = local_2570[lVar51];
                local_24b0 = vshufps_avx(ZEXT416(uVar48),ZEXT416(uVar48),0);
                uVar46 = *(undefined4 *)(lVar59 + 0xa0 + lVar51 * 4);
                local_24c0._4_4_ = uVar46;
                local_24c0._0_4_ = uVar46;
                local_24c0._8_4_ = uVar46;
                local_24c0._12_4_ = uVar46;
                uVar46 = *(undefined4 *)(local_2550 + lVar51 * 4);
                local_2500 = *(undefined4 *)((long)&local_2540 + lVar51 * 4);
                uVar3 = *(undefined4 *)((long)&local_2530 + lVar51 * 4);
                local_24f0._4_4_ = uVar3;
                local_24f0._0_4_ = uVar3;
                local_24f0._8_4_ = uVar3;
                local_24f0._12_4_ = uVar3;
                local_2510[0] = (RTCHitN)(char)uVar46;
                local_2510[1] = (RTCHitN)(char)((uint)uVar46 >> 8);
                local_2510[2] = (RTCHitN)(char)((uint)uVar46 >> 0x10);
                local_2510[3] = (RTCHitN)(char)((uint)uVar46 >> 0x18);
                local_2510[4] = (RTCHitN)(char)uVar46;
                local_2510[5] = (RTCHitN)(char)((uint)uVar46 >> 8);
                local_2510[6] = (RTCHitN)(char)((uint)uVar46 >> 0x10);
                local_2510[7] = (RTCHitN)(char)((uint)uVar46 >> 0x18);
                local_2510[8] = (RTCHitN)(char)uVar46;
                local_2510[9] = (RTCHitN)(char)((uint)uVar46 >> 8);
                local_2510[10] = (RTCHitN)(char)((uint)uVar46 >> 0x10);
                local_2510[0xb] = (RTCHitN)(char)((uint)uVar46 >> 0x18);
                local_2510[0xc] = (RTCHitN)(char)uVar46;
                local_2510[0xd] = (RTCHitN)(char)((uint)uVar46 >> 8);
                local_2510[0xe] = (RTCHitN)(char)((uint)uVar46 >> 0x10);
                local_2510[0xf] = (RTCHitN)(char)((uint)uVar46 >> 0x18);
                uStack_24fc = local_2500;
                uStack_24f8 = local_2500;
                uStack_24f4 = local_2500;
                fStack_24cc = local_24d0;
                fStack_24c8 = local_24d0;
                fStack_24c4 = local_24d0;
                vcmpps_avx(ZEXT1632(local_24e0),ZEXT1632(local_24e0),0xf);
                uStack_249c = context->user->instID[0];
                local_24a0 = uStack_249c;
                uStack_2498 = uStack_249c;
                uStack_2494 = uStack_249c;
                uStack_2490 = context->user->instPrimID[0];
                uStack_248c = uStack_2490;
                uStack_2488 = uStack_2490;
                uStack_2484 = uStack_2490;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + lVar51 * 4);
                local_2650 = *local_2620;
                local_2610.valid = (int *)local_2650;
                local_2610.geometryUserPtr = *(void **)(lVar4 + 0x18);
                local_2610.context = context->user;
                local_2610.hit = local_2510;
                local_2610.N = 4;
                local_2638 = lVar59;
                local_2630 = lVar56;
                local_2628 = lVar54;
                local_2610.ray = (RTCRayN *)ray;
                if (*(code **)(lVar4 + 0x40) != (code *)0x0) {
                  (**(code **)(lVar4 + 0x40))(&local_2610);
                }
                if (local_2650 == (undefined1  [16])0x0) {
                  auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar72 = auVar72 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar4 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var5)(&local_2610);
                  }
                  auVar84 = vpcmpeqd_avx(local_2650,_DAT_01f7aa10);
                  auVar72 = auVar84 ^ _DAT_01f7ae20;
                  if (local_2650 != (undefined1  [16])0x0) {
                    auVar84 = auVar84 ^ _DAT_01f7ae20;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])local_2610.hit);
                    *(undefined1 (*) [16])(local_2610.ray + 0xc0) = auVar90;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x10));
                    *(undefined1 (*) [16])(local_2610.ray + 0xd0) = auVar90;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x20));
                    *(undefined1 (*) [16])(local_2610.ray + 0xe0) = auVar90;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x30));
                    *(undefined1 (*) [16])(local_2610.ray + 0xf0) = auVar90;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x40));
                    *(undefined1 (*) [16])(local_2610.ray + 0x100) = auVar90;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x50));
                    *(undefined1 (*) [16])(local_2610.ray + 0x110) = auVar90;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x60));
                    *(undefined1 (*) [16])(local_2610.ray + 0x120) = auVar90;
                    auVar90 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x70));
                    *(undefined1 (*) [16])(local_2610.ray + 0x130) = auVar90;
                    auVar84 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])(local_2610.hit + 0x80));
                    *(undefined1 (*) [16])(local_2610.ray + 0x140) = auVar84;
                  }
                }
                auVar67._8_8_ = 0x100000001;
                auVar67._0_8_ = 0x100000001;
                if ((auVar67 & auVar72) == (undefined1  [16])0x0) {
                  local_2690._0_4_ = auVar93._0_4_;
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_2690._0_4_;
                  local_2690 = auVar93._0_16_;
                }
                else {
                  local_2690 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2670 + lVar51 * 4) = 0;
                auVar93 = ZEXT1664(local_2690);
                auVar72 = vshufps_avx(local_2690,local_2690,0);
                auVar95 = ZEXT1664(local_2520);
                auVar72 = vcmpps_avx(local_2520,auVar72,2);
                local_2670 = vandps_avx(auVar72,local_2670);
                lVar54 = local_2628;
                lVar56 = local_2630;
                lVar59 = local_2638;
              }
              if ((((local_2670 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2670 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2670 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2670[0xf]) goto LAB_003e5dd5;
              auVar83._8_4_ = 0x7f800000;
              auVar83._0_8_ = 0x7f8000007f800000;
              auVar83._12_4_ = 0x7f800000;
              auVar72 = vblendvps_avx(auVar83,auVar95._0_16_,local_2670);
              auVar84 = vshufps_avx(auVar72,auVar72,0xb1);
              auVar84 = vminps_avx(auVar84,auVar72);
              auVar90 = vshufpd_avx(auVar84,auVar84,1);
              auVar84 = vminps_avx(auVar90,auVar84);
              auVar84 = vcmpps_avx(auVar72,auVar84,0);
              auVar90 = local_2670 & auVar84;
              auVar72 = local_2670;
              if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar90[0xf] < '\0') {
                auVar72 = vandps_avx(auVar84,local_2670);
              }
              uVar46 = vmovmskps_avx(auVar72);
              uVar58 = CONCAT44((int)((ulong)lVar51 >> 0x20),uVar46);
              lVar51 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                }
              }
              goto LAB_003e5f3c;
            }
          }
LAB_003e5dd5:
          lVar56 = lVar56 + 1;
        } while (lVar56 != lVar54);
      }
      uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar68 = ZEXT3264(CONCAT428(uVar46,CONCAT424(uVar46,CONCAT420(uVar46,CONCAT416(uVar46,
                                                  CONCAT412(uVar46,CONCAT48(uVar46,CONCAT44(uVar46,
                                                  uVar46))))))));
      auVar93 = ZEXT3264(local_23c0);
      auVar95 = ZEXT3264(local_23e0);
      auVar97 = ZEXT3264(local_2400);
      auVar99 = ZEXT3264(local_2420);
      auVar100 = ZEXT3264(local_2440);
      auVar104 = ZEXT3264(local_2460);
      auVar109 = ZEXT3264(local_2480);
    }
    if (pauVar47 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }